

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_ctstring.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  size_t sVar2;
  ostream *poVar3;
  value_type *__val;
  size_t buf [77];
  string local_298;
  undefined1 local_280;
  undefined1 local_27f;
  undefined1 local_27e;
  undefined1 local_27d;
  undefined1 local_27c;
  undefined1 local_27b;
  undefined1 local_27a;
  undefined1 local_279;
  undefined1 local_278;
  undefined1 local_277;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  undefined1 local_273;
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  undefined1 local_255;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined1 local_24c;
  
  printf("plain 1: %s\n","Hello");
  printf("plain 2: %s\n","HELLO");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"xored: ",7);
  pcVar1 = (pointer)operator_new(0x4d);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1 + 0x4d;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar1[0x28] = '\0';
  pcVar1[0x29] = '\0';
  pcVar1[0x2a] = '\0';
  pcVar1[0x2b] = '\0';
  pcVar1[0x2c] = '\0';
  pcVar1[0x2d] = '\0';
  pcVar1[0x2e] = '\0';
  pcVar1[0x2f] = '\0';
  pcVar1[0x30] = '\0';
  pcVar1[0x31] = '\0';
  pcVar1[0x32] = '\0';
  pcVar1[0x33] = '\0';
  pcVar1[0x34] = '\0';
  pcVar1[0x35] = '\0';
  pcVar1[0x36] = '\0';
  pcVar1[0x37] = '\0';
  pcVar1[0x38] = '\0';
  pcVar1[0x39] = '\0';
  pcVar1[0x3a] = '\0';
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x40] = '\0';
  pcVar1[0x41] = '\0';
  pcVar1[0x42] = '\0';
  pcVar1[0x43] = '\0';
  pcVar1[0x44] = '\0';
  pcVar1[0x45] = '\0';
  pcVar1[0x46] = '\0';
  pcVar1[0x47] = '\0';
  pcVar1[0x48] = '\0';
  pcVar1[0x49] = '\0';
  pcVar1[0x4a] = '\0';
  pcVar1[0x4b] = '\0';
  pcVar1[0x4c] = '\0';
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = pcVar1;
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  sVar2 = cts::anon_unknown_2::decode(0x8dfeb2ae,0,0x8dfeb2e8);
  *pcVar1 = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x664e79a3,1,0x664e7927);
  pcVar1[1] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x877fa50a,2,0x877fa45a);
  pcVar1[2] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x63025b1,3,0x63027f1);
  pcVar1[3] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa354052c,4,0xa354009c);
  pcVar1[4] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xf2d2a0b,5,0xf2d234b);
  pcVar1[5] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x701cb4ae,6,0x701ca02e);
  pcVar1[6] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xfa3369e6,7,0xfa3369b5);
  pcVar1[7] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbfd66f14,8,0xbfd66f90);
  pcVar1[8] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4fd5fd0b,9,0x4fd5fdaf);
  pcVar1[9] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x53778db2,10,0x53778f42);
  pcVar1[10] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1a078089,0xb,0x1a0785b9);
  pcVar1[0xb] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x9d297964,0xc,0x9d2973c4);
  pcVar1[0xc] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x9cdf453,0xd,0x9cdec53);
  pcVar1[0xd] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xdc2805b8,0xe,0xdc280596);
  pcVar1[0xe] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe856ff39,0xf,0xe856fffd);
  pcVar1[0xf] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xb28dc0a8,0x10,0xb28dc138);
  pcVar1[0x10] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa716102f,0x11,0xa7161337);
  pcVar1[0x11] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6494d29a,0x12,0x6494d72a);
  pcVar1[0x12] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa8d290a1,0x13,0xa8d29c81);
  pcVar1[0x13] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2155d2c,0x14,0x2154bec);
  pcVar1[0x14] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x3dcfd66e,0x15,0x3dcfd65b);
  pcVar1[0x15] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1e48172c,0x16,0x1e4817fe);
  pcVar1[0x16] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd7755e39,0x17,0xd7755f45);
  pcVar1[0x17] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x3f1744d8,0x18,0x3f1747e0);
  pcVar1[0x18] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbc20df5f,0x19,0xbc20d9bf);
  pcVar1[0x19] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x248310d2,0x1a,0x24831c12);
  pcVar1[0x1a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x12089b89,0x1b,0x12088c49);
  pcVar1[0x1b] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x41e42928,0x1c,0x41e42914);
  pcVar1[0x1c] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x805701b5,0x1d,0x80570163);
  pcVar1[0x1d] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x8e1276d2,0x1e,0x8e127766);
  pcVar1[0x1e] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x77e7a415,0x1f,0x77e7a78d);
  pcVar1[0x1f] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xfcb9a788,0x20,0xfcb9a388);
  pcVar1[0x20] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x14c7d27,0x21,0x14c7147);
  pcVar1[0x21] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd261e43a,0x22,0xd261fdfa);
  pcVar1[0x22] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc4047552,0x23,0xc4047511);
  pcVar1[0x23] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x65f6abd2,0x24,0x65f6ab3c);
  pcVar1[0x24] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6b0b8cc3,0x25,0x6b0b8d6b);
  pcVar1[0x25] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x15d0c096,0x26,0x15d0c3ce);
  pcVar1[0x26] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa52aff85,0x27,0xa52af8d5);
  pcVar1[0x27] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xb8f7d30,0x28,0xb8f7430);
  pcVar1[0x28] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x53b2e54f,0x29,0x53b2f9cf);
  pcVar1[0x29] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x31451c9a,0x2a,0x31451ce2);
  pcVar1[0x2a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1885764f,0x2b,0x188576d9);
  pcVar1[0x2b] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x43c173dc,0x2c,0x43c17264);
  pcVar1[0x2c] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xec9999c3,0x2d,0xec999a73);
  pcVar1[0x2d] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x89009af6,0x2e,0x89009d36);
  pcVar1[0x2e] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xca607d1d,0x2f,0xca60731d);
  pcVar1[0x2f] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2f077958,0x30,0x2f0759d8);
  pcVar1[0x30] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x53b293dd,0x31,0x53b29357);
  pcVar1[0x31] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6b4186e,0x32,0x6b418ca);
  pcVar1[0x32] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc12eb041,0x33,0xc12eb1a1);
  pcVar1[0x33] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xff4d1d64,0x34,0xff4d1e8c);
  pcVar1[0x34] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe93140eb,0x35,0xe931487b);
  pcVar1[0x35] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcad3ac5e,0x36,0xcad3a39e);
  pcVar1[0x36] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd6cd2965,0x37,0xd6cd3665);
  pcVar1[0x37] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x3863f40a,0x38,0x3863f480);
  pcVar1[0x38] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcd6d5d6d,0x39,0xcd6d5ddf);
  pcVar1[0x39] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x692a93b2,0x3a,0x692a91b2);
  pcVar1[0x3a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc40741e9,0x3b,0xc4074569);
  pcVar1[0x3b] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xddb64734,0x3c,0xddb64fb4);
  pcVar1[0x3c] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xeb06a6a3,0x3d,0xeb06b783);
  pcVar1[0x3d] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc4af6086,0x3e,0xc4af7706);
  pcVar1[0x3e] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc25a6223,0x3f,0xc25a62ad);
  pcVar1[0x3f] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc13be50c,0x40,0xc13be428);
  pcVar1[0x40] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x314978e3,0x41,0x31497967);
  pcVar1[0x41] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xde9823c2,0x42,0xde98279a);
  pcVar1[0x42] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7fa5b21,0x43,0x7fa5231);
  pcVar1[0x43] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x67ada95c,0x44,0x67ada5dc);
  pcVar1[0x44] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe2d222cb,0x45,0xe2d2078b);
  pcVar1[0x45] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2cadb7e1,0x46,0x2cadb76e);
  pcVar1[0x46] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa21516ed,0x47,0xa21517f5);
  pcVar1[0x47] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x35f9cafc,0x48,0x35f9c8d0);
  pcVar1[0x48] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1c71019f,0x49,0x1c7105ef);
  pcVar1[0x49] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4ae07352,0x4a,0x4ae07a82);
  pcVar1[0x4a] = (char)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7156fa79,0x4b,0x7156f7f9);
  pcVar1[0x4b] = (char)sVar2;
  poVar3 = cts::operator<<((ostream *)&std::cout,&local_298);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cts::string::~string(&local_298);
  sVar2 = cts::anon_unknown_2::decode(0x8dfeb2ae,0,0x8dfeb2e8);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,(char)sVar2);
  sVar2 = cts::anon_unknown_2::decode(0x664e79a3,1,0x664e7927);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_2_ =
       CONCAT11((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_);
  sVar2 = cts::anon_unknown_2::decode(0x877fa50a,2,0x877fa45a);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_3_ =
       CONCAT12((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_2_);
  sVar2 = cts::anon_unknown_2::decode(0x63025b1,3,0x63027f1);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ =
       CONCAT13((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_3_);
  sVar2 = cts::anon_unknown_2::decode(0xa354052c,4,0xa354009c);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_5_ =
       CONCAT14((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_);
  sVar2 = cts::anon_unknown_2::decode(0xf2d2a0b,5,0xf2d234b);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_6_ =
       CONCAT15((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_5_);
  sVar2 = cts::anon_unknown_2::decode(0x701cb4ae,6,0x701ca02e);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_7_ =
       CONCAT16((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_6_);
  sVar2 = cts::anon_unknown_2::decode(0xfa3369e6,7,0xfa3369b5);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT17((char)sVar2,
                               local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_7_);
  sVar2 = cts::anon_unknown_2::decode(0xbfd66f14,8,0xbfd66f90);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT71(local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._1_7_,(char)sVar2);
  sVar2 = cts::anon_unknown_2::decode(0x4fd5fd0b,9,0x4fd5fdaf);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ =
       CONCAT11((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_1_);
  sVar2 = cts::anon_unknown_2::decode(0x53778db2,10,0x53778f42);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_3_ =
       CONCAT12((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_2_);
  sVar2 = cts::anon_unknown_2::decode(0x1a078089,0xb,0x1a0785b9);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ =
       CONCAT13((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_3_);
  sVar2 = cts::anon_unknown_2::decode(0x9d297964,0xc,0x9d2973c4);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_5_ =
       CONCAT14((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_);
  sVar2 = cts::anon_unknown_2::decode(0x9cdf453,0xd,0x9cdec53);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_6_ =
       CONCAT15((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_5_);
  sVar2 = cts::anon_unknown_2::decode(0xdc2805b8,0xe,0xdc280596);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_7_ =
       CONCAT16((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish._0_6_);
  sVar2 = cts::anon_unknown_2::decode(0xe856ff39,0xf,0xe856fffd);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT17((char)sVar2,
                                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_7_);
  sVar2 = cts::anon_unknown_2::decode(0xb28dc0a8,0x10,0xb28dc138);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT71(local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._1_7_,(char)sVar2);
  sVar2 = cts::anon_unknown_2::decode(0xa716102f,0x11,0xa7161337);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ =
       CONCAT11((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_1_);
  sVar2 = cts::anon_unknown_2::decode(0x6494d29a,0x12,0x6494d72a);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_3_ =
       CONCAT12((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_2_);
  sVar2 = cts::anon_unknown_2::decode(0xa8d290a1,0x13,0xa8d29c81);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       CONCAT13((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_3_);
  sVar2 = cts::anon_unknown_2::decode(0x2155d2c,0x14,0x2154bec);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_5_ =
       CONCAT14((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  sVar2 = cts::anon_unknown_2::decode(0x3dcfd66e,0x15,0x3dcfd65b);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_6_ =
       CONCAT15((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_5_);
  sVar2 = cts::anon_unknown_2::decode(0x1e48172c,0x16,0x1e4817fe);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_7_ =
       CONCAT16((char)sVar2,
                local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_6_);
  sVar2 = cts::anon_unknown_2::decode(0xd7755e39,0x17,0xd7755f45);
  local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT17((char)sVar2,
                         local_298.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_7_);
  sVar2 = cts::anon_unknown_2::decode(0x3f1744d8,0x18,0x3f1747e0);
  local_280 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xbc20df5f,0x19,0xbc20d9bf);
  local_27f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x248310d2,0x1a,0x24831c12);
  local_27e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x12089b89,0x1b,0x12088c49);
  local_27d = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x41e42928,0x1c,0x41e42914);
  local_27c = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x805701b5,0x1d,0x80570163);
  local_27b = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x8e1276d2,0x1e,0x8e127766);
  local_27a = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x77e7a415,0x1f,0x77e7a78d);
  local_279 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xfcb9a788,0x20,0xfcb9a388);
  local_278 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x14c7d27,0x21,0x14c7147);
  local_277 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd261e43a,0x22,0xd261fdfa);
  local_276 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc4047552,0x23,0xc4047511);
  local_275 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x65f6abd2,0x24,0x65f6ab3c);
  local_274 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6b0b8cc3,0x25,0x6b0b8d6b);
  local_273 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x15d0c096,0x26,0x15d0c3ce);
  local_272 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa52aff85,0x27,0xa52af8d5);
  local_271 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xb8f7d30,0x28,0xb8f7430);
  local_270 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x53b2e54f,0x29,0x53b2f9cf);
  local_26f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x31451c9a,0x2a,0x31451ce2);
  local_26e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1885764f,0x2b,0x188576d9);
  local_26d = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x43c173dc,0x2c,0x43c17264);
  local_26c = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xec9999c3,0x2d,0xec999a73);
  local_26b = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x89009af6,0x2e,0x89009d36);
  local_26a = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xca607d1d,0x2f,0xca60731d);
  local_269 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2f077958,0x30,0x2f0759d8);
  local_268 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x53b293dd,0x31,0x53b29357);
  local_267 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x6b4186e,0x32,0x6b418ca);
  local_266 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc12eb041,0x33,0xc12eb1a1);
  local_265 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xff4d1d64,0x34,0xff4d1e8c);
  local_264 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe93140eb,0x35,0xe931487b);
  local_263 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcad3ac5e,0x36,0xcad3a39e);
  local_262 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xd6cd2965,0x37,0xd6cd3665);
  local_261 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x3863f40a,0x38,0x3863f480);
  local_260 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xcd6d5d6d,0x39,0xcd6d5ddf);
  local_25f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x692a93b2,0x3a,0x692a91b2);
  local_25e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc40741e9,0x3b,0xc4074569);
  local_25d = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xddb64734,0x3c,0xddb64fb4);
  local_25c = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xeb06a6a3,0x3d,0xeb06b783);
  local_25b = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc4af6086,0x3e,0xc4af7706);
  local_25a = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc25a6223,0x3f,0xc25a62ad);
  local_259 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xc13be50c,0x40,0xc13be428);
  local_258 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x314978e3,0x41,0x31497967);
  local_257 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xde9823c2,0x42,0xde98279a);
  local_256 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7fa5b21,0x43,0x7fa5231);
  local_255 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x67ada95c,0x44,0x67ada5dc);
  local_254 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xe2d222cb,0x45,0xe2d2078b);
  local_253 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x2cadb7e1,0x46,0x2cadb76e);
  local_252 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0xa21516ed,0x47,0xa21517f5);
  local_251 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x35f9cafc,0x48,0x35f9c8d0);
  local_250 = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x1c71019f,0x49,0x1c7105ef);
  local_24f = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x4ae07352,0x4a,0x4ae07a82);
  local_24e = (undefined1)sVar2;
  sVar2 = cts::anon_unknown_2::decode(0x7156fa79,0x4b,0x7156f7f9);
  local_24d = (undefined1)sVar2;
  local_24c = 0;
  printf("in-buf(xored): %s\n",&local_298);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	using namespace cts::literals;

	auto sample1 = "Hello"_chars;
	auto sample2 = "Hello"_ichars;

	//std::printf("%s = %u:%u:%u\n", __TIME__, CTS_TIME(0), CTS_TIME(3), CTS_TIME(6));
	std::printf("plain 1: %s\n", sample1.c_str());
	std::printf("plain 2: %s\n", sample2.c_str());

	{
		char constexpr csz[] = "Hello World";
		static_assert(sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}
	{
		char constexpr csz[] = "hello world";
		static_assert(!sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}

	auto sample3 = "HELLO"_chars;
	{
		char constexpr csz[] = "helLO worLD";
		static_assert(!sample3.match(csz, csz+sizeof(csz)), "");
		static_assert(sample3.match(csz, csz+sizeof(csz), 3), "");
		static_assert(!sample3.match(csz, csz+sizeof(csz), 5), "");
	}

	auto const xsHidden = "FAREWELL: THIS STRING SHOULD NOT BE SEEN IN BINARY EITHER FULL OR IN PIECES!"_xchars;
	std::cout << "xored: " << xsHidden.str() << std::endl;

	std::size_t buf[xsHidden.size()+1];
	std::printf("in-buf(xored): %s\n", xsHidden.str(buf));

	return 0;
}